

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O3

bool __thiscall
cmArgumentParser<void>::Bind<std::__cxx11::string>
          (cmArgumentParser<void> *this,string_view name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref)

{
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:133:16)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:133:16)>
             ::_M_manager;
  local_28._M_unused._M_object = ref;
  pVar1 = ArgumentParser::ActionMap::Emplace(&this->Bindings,name,(Action *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (bool)(pVar1.second & 1);
}

Assistant:

bool Bind(cm::string_view name, T& ref)
  {
    return this->Bindings
      .Emplace(name,
               [&ref](ArgumentParser::Instance& instance, void*) {
                 instance.Bind(ref);
               })
      .second;
  }